

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O2

int SHMRelease(void)

{
  lock_count.m_val = lock_count.m_val + -1;
  CCLock::Leave(&shm_critsec);
  return lock_count.m_val;
}

Assistant:

int SHMRelease(void)
{
    lock_count--;
    shm_critsec.Leave();

    return lock_count;
}